

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirENCODING(void)

{
  int iVar1;
  int iVar2;
  char *aP;
  string arg;
  char *local_30;
  string local_28;
  
  GetDelimitedString_abi_cxx11_(&local_28,&lp);
  local_30 = local_28._M_dataplus._M_p;
  iVar2 = cmphstr(&local_30,"dos",false);
  iVar1 = 0;
  if (iVar2 == 0) {
    iVar2 = cmphstr(&local_30,"win",false);
    iVar1 = 1;
    if (iVar2 == 0) {
      Error("[ENCODING] Invalid argument (valid values: \"dos\" and \"win\")",local_30,IF_FIRST);
      iVar1 = ConvertEncoding;
    }
  }
  ConvertEncoding = iVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void dirENCODING() {
	auto arg = GetDelimitedString(lp);
	char* aP = arg.data();
	if (cmphstr(aP, "dos")) {
		ConvertEncoding = ENCDOS;
	} else if (cmphstr(aP, "win")) {
		ConvertEncoding = ENCWIN;
	} else {
		Error("[ENCODING] Invalid argument (valid values: \"dos\" and \"win\")", aP, IF_FIRST);
	}
}